

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O3

void Kit_TruthCofSupports
               (Vec_Int_t *vBddDir,Vec_Int_t *vBddInv,int nVars,Vec_Int_t *vMemory,uint *puSupps)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  byte bVar4;
  int *piVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  int *piVar14;
  size_t __size;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  
  uVar3 = (long)nVars * 2;
  lVar12 = (long)vBddDir->nSize * uVar3;
  iVar11 = (int)lVar12;
  if ((vMemory->nSize < iVar11) && (vMemory->nCap < iVar11)) {
    sVar13 = lVar12 * 4;
    if (vMemory->pArray == (int *)0x0) {
      piVar5 = (int *)malloc(sVar13);
    }
    else {
      piVar5 = (int *)realloc(vMemory->pArray,sVar13);
    }
    vMemory->pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_005cfdcd;
    vMemory->nCap = iVar11;
  }
  piVar7 = vMemory->pArray;
  iVar11 = (int)uVar3;
  lVar12 = (long)iVar11;
  sVar13 = lVar12 * 4;
  piVar5 = (int *)0x0;
  memset(piVar7,0,sVar13);
  if (1 < vBddDir->nSize) {
    uVar6 = 1;
    if (1 < iVar11) {
      uVar6 = uVar3 & 0xffffffff;
    }
    piVar2 = vBddDir->pArray;
    lVar15 = 1;
    piVar14 = piVar7;
    do {
      piVar14 = piVar14 + lVar12;
      uVar1 = piVar2[lVar15];
      iVar8 = (~uVar1 | 0xffffffe0) + nVars;
      iVar17 = (uVar1 >> 0x11 & 0xfff) * iVar11;
      iVar16 = (uVar1 >> 5 & 0xfff) * iVar11;
      if (0 < nVars) {
        uVar19 = 0;
        do {
          piVar14[uVar19] =
               piVar7[(long)iVar17 + uVar19] | 1 << ((byte)iVar8 & 0x1f) |
               piVar7[(long)iVar16 + uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar6 != uVar19);
      }
      lVar18 = (long)(iVar8 * 2);
      lVar10 = (long)(iVar8 * 2 + 1);
      if (piVar7[iVar17 + lVar18] != piVar7[iVar17 + lVar10]) {
        __assert_fail("pFan0[2*Var + 0] == pFan0[2*Var + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                      ,0x14f,
                      "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                     );
      }
      if (piVar7[iVar16 + lVar18] != piVar7[iVar16 + lVar10]) {
        __assert_fail("pFan1[2*Var + 0] == pFan1[2*Var + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                      ,0x150,
                      "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                     );
      }
      piVar5 = piVar7 + lVar15 * lVar12;
      piVar5[lVar18] = piVar7[iVar17 + lVar18];
      piVar5[lVar10] = piVar7[iVar16 + lVar18];
      lVar15 = lVar15 + 1;
    } while (lVar15 < vBddDir->nSize);
  }
  memcpy(puSupps,piVar5,sVar13);
  lVar15 = vBddInv->nSize * lVar12;
  iVar8 = (int)lVar15;
  if (vMemory->nSize < iVar8) {
    piVar7 = vMemory->pArray;
    if (vMemory->nCap < iVar8) {
      __size = lVar15 * 4;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc(__size);
      }
      else {
        piVar7 = (int *)realloc(piVar7,__size);
      }
      vMemory->pArray = piVar7;
      if (piVar7 == (int *)0x0) {
LAB_005cfdcd:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vMemory->nCap = iVar8;
    }
  }
  else {
    piVar7 = vMemory->pArray;
  }
  memset(piVar7,0,sVar13);
  if (1 < vBddInv->nSize) {
    uVar6 = 1;
    if (1 < iVar11) {
      uVar6 = uVar3 & 0xffffffff;
    }
    piVar2 = vBddInv->pArray;
    lVar15 = 1;
    piVar14 = piVar7;
    do {
      piVar14 = piVar14 + lVar12;
      uVar1 = piVar2[lVar15];
      uVar9 = uVar1 & 0x1f;
      iVar16 = (uVar1 >> 0x11 & 0xfff) * iVar11;
      iVar8 = (uVar1 >> 5 & 0xfff) * iVar11;
      if (0 < nVars) {
        uVar19 = 0;
        do {
          piVar14[uVar19] =
               piVar7[(long)iVar16 + uVar19] | 1 << (sbyte)uVar9 | piVar7[(long)iVar8 + uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar6 != uVar19);
      }
      uVar19 = (ulong)(uVar9 * 2 + 1);
      if (piVar7[(long)iVar16 + (ulong)uVar9 * 2] != piVar7[(long)iVar16 + uVar19]) {
        __assert_fail("pFan0[2*Var + 0] == pFan0[2*Var + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                      ,0x169,
                      "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                     );
      }
      if (piVar7[(long)iVar8 + (ulong)(uVar9 * 2)] != piVar7[(long)iVar8 + uVar19]) {
        __assert_fail("pFan1[2*Var + 0] == pFan1[2*Var + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                      ,0x16a,
                      "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                     );
      }
      piVar5 = piVar7 + lVar15 * lVar12;
      *(int *)((long)piVar5 + (ulong)(uVar9 << 3)) = piVar7[(long)iVar16 + (ulong)uVar9 * 2];
      piVar5[uVar19] = *(int *)((long)piVar7 + (ulong)(uVar9 << 3) + (long)iVar8 * 4);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vBddInv->nSize);
  }
  if (0 < nVars) {
    uVar6 = 0;
    do {
      if (uVar6 == 0x42) {
        __assert_fail("nBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                      ,0xe4,"unsigned int Kit_BitMask(int)");
      }
      bVar4 = (byte)(uVar6 >> 1);
      puSupps[uVar6] =
           ((piVar5[uVar6] ^ puSupps[uVar6]) >> (bVar4 & 0x1f)) << (bVar4 & 0x1f) ^ puSupps[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uVar3 & 0xffffffff) != uVar6);
  }
  return;
}

Assistant:

void Kit_TruthCofSupports( Vec_Int_t * vBddDir, Vec_Int_t * vBddInv, int nVars, Vec_Int_t * vMemory, unsigned * puSupps )
{
    Kit_Mux_t Mux;
    unsigned * puSuppAll;
    unsigned * pThis = NULL; // Suppress "might be used uninitialized"
    unsigned * pFan0, * pFan1;
    int i, v, Var, Entry, nSupps;
    nSupps = 2 * nVars;

    // extend storage
    if ( Vec_IntSize( vMemory ) < nSupps * Vec_IntSize(vBddDir) )
        Vec_IntGrow( vMemory, nSupps * Vec_IntSize(vBddDir) );
    puSuppAll = (unsigned *)Vec_IntArray( vMemory );
    // clear storage for the const node
    memset( puSuppAll, 0, sizeof(unsigned) * nSupps );
    // compute supports from nodes
    Vec_IntForEachEntryStart( vBddDir, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
        Var = nVars - 1 - Mux.v;
        pFan0 = puSuppAll + nSupps * Mux.e;
        pFan1 = puSuppAll + nSupps * Mux.t;
        pThis = puSuppAll + nSupps * i;
        for ( v = 0; v < nSupps; v++ )
            pThis[v] = pFan0[v] | pFan1[v] | (1<<Var);
        assert( pFan0[2*Var + 0] == pFan0[2*Var + 1] );
        assert( pFan1[2*Var + 0] == pFan1[2*Var + 1] );
        pThis[2*Var + 0] = pFan0[2*Var + 0];// | pFan0[2*Var + 1];
        pThis[2*Var + 1] = pFan1[2*Var + 0];// | pFan1[2*Var + 1];
    }
    // copy the result
    memcpy( puSupps, pThis, sizeof(unsigned) * nSupps );
    // compute the inverse

    // extend storage
    if ( Vec_IntSize( vMemory ) < nSupps * Vec_IntSize(vBddInv) )
        Vec_IntGrow( vMemory, nSupps * Vec_IntSize(vBddInv) );
    puSuppAll = (unsigned *)Vec_IntArray( vMemory );
    // clear storage for the const node
    memset( puSuppAll, 0, sizeof(unsigned) * nSupps );
    // compute supports from nodes
    Vec_IntForEachEntryStart( vBddInv, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
//        Var = nVars - 1 - Mux.v;
        Var = Mux.v;
        pFan0 = puSuppAll + nSupps * Mux.e;
        pFan1 = puSuppAll + nSupps * Mux.t;
        pThis = puSuppAll + nSupps * i;
        for ( v = 0; v < nSupps; v++ )
            pThis[v] = pFan0[v] | pFan1[v] | (1<<Var);
        assert( pFan0[2*Var + 0] == pFan0[2*Var + 1] );
        assert( pFan1[2*Var + 0] == pFan1[2*Var + 1] );
        pThis[2*Var + 0] = pFan0[2*Var + 0];// | pFan0[2*Var + 1];
        pThis[2*Var + 1] = pFan1[2*Var + 0];// | pFan1[2*Var + 1];
    }

    // merge supports
    for ( Var = 0; Var < nSupps; Var++ )
        puSupps[Var] = (puSupps[Var] & Kit_BitMask(Var/2)) | (pThis[Var] & ~Kit_BitMask(Var/2));
}